

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void make_checkpoint(int actions)

{
  long lVar1;
  nh_option_desc *pnVar2;
  int actions_local;
  
  if ((((cpcount < 1) ||
       ((checkpoints[cpcount + -1].actions + 1000 < actions &&
        (lVar1 = true_moves(), checkpoints[cpcount + -1].moves < lVar1)))) && (multi == 0)) &&
     (occupation == (_func_int *)0x0)) {
    replay_sync_save();
    cpcount = cpcount + 1;
    checkpoints = (replay_checkpoint *)realloc(checkpoints,(long)cpcount * 0x1fd8);
    checkpoints[cpcount + -1].actions = actions;
    checkpoints[cpcount + -1].moves = moves;
    lVar1 = ftell((FILE *)loginfo.flog);
    checkpoints[cpcount + -1].nexttoken = (int)lVar1;
    pnVar2 = clone_optlist(options);
    checkpoints[cpcount + -1].opt = pnVar2;
    mnew(&checkpoints[cpcount + -1].cpdata,(memfile *)0x0);
    savegame(&checkpoints[cpcount + -1].cpdata);
    checkpoints[cpcount + -1].cpdata.len = checkpoints[cpcount + -1].cpdata.pos;
    checkpoints[cpcount + -1].cpdata.pos = 0;
  }
  return;
}

Assistant:

static void make_checkpoint(int actions)
{
    /* only make a checkpoint if enough actions have happened since the last
     * one and creating a checkpoint is safe */
    if ((cpcount > 0 && (actions <= checkpoints[cpcount-1].actions + 1000 ||
	                 true_moves() <= checkpoints[cpcount-1].moves)) ||
	multi || occupation) /* checkpointing while something is in progress doesn't work */
	return;

    replay_sync_save();

    cpcount++;
    checkpoints = realloc(checkpoints, sizeof(struct replay_checkpoint) * cpcount);
    checkpoints[cpcount-1].actions = actions;
    checkpoints[cpcount-1].moves = moves;
    checkpoints[cpcount-1].nexttoken = ftell(loginfo.flog);
    /* the active option list must be saved: it is not part of the normal binary save */
    checkpoints[cpcount-1].opt = clone_optlist(options);
    mnew(&checkpoints[cpcount-1].cpdata, NULL);
    savegame(&checkpoints[cpcount-1].cpdata);
    checkpoints[cpcount-1].cpdata.len = checkpoints[cpcount-1].cpdata.pos;
    checkpoints[cpcount-1].cpdata.pos = 0;
}